

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateBool
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst,
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *diag)

{
  bool bVar1;
  spv_result_t sVar2;
  Instruction *inst_00;
  uint32_t underlying_type;
  undefined1 local_6c [36];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  inst_00 = (Instruction *)local_6c;
  local_6c._0_4_ = 0;
  sVar2 = GetUnderlyingType(this->_,decoration,inst,(uint32_t *)inst_00);
  if (sVar2 == SPV_SUCCESS) {
    bVar1 = ValidationState_t::IsBoolScalarType(this->_,local_6c._0_4_);
    sVar2 = SPV_SUCCESS;
    if (!bVar1) {
      (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                ((string *)(local_6c + 4),decoration,(Decoration *)inst,inst_00);
      std::operator+(&local_48,(string *)(local_6c + 4)," is not a bool scalar.");
      sVar2 = std::
              function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::operator()(diag,&local_48);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
  }
  return sVar2;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateBool(
    const Decoration& decoration, const Instruction& inst,
    const std::function<spv_result_t(const std::string& message)>& diag) {
  uint32_t underlying_type = 0;
  if (spv_result_t error =
          GetUnderlyingType(_, decoration, inst, &underlying_type)) {
    return error;
  }

  if (!_.IsBoolScalarType(underlying_type)) {
    return diag(GetDefinitionDesc(decoration, inst) + " is not a bool scalar.");
  }

  return SPV_SUCCESS;
}